

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

string * __thiscall
pfederc::ModExpr::toString_abi_cxx11_(string *__return_storage_ptr__,ModExpr *this)

{
  pointer puVar1;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr;
  pointer puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (*this->tokId->_vptr_Token[2])(&local_48,this->tokId,(this->super_Expr).lexer);
  std::operator+(&bStack_68,"module ",&local_48);
  std::operator+(__return_storage_ptr__,&bStack_68,'\n');
  std::__cxx11::string::~string((string *)&bStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  puVar1 = (this->exprs).
           super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->exprs).
                super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    (*((puVar2->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t
       .super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&bStack_68);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&bStack_68);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ModExpr::toString() const noexcept {
  std::string result = "module " + getIdentifier().toString(getLexer()) + '\n';
  for (const auto &expr : exprs) {
    result += expr->toString();
    result += '\n';
  }
  result += ';';
  return result;
}